

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O2

iterator __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
::find(sherwood_v3_table<const_slang::ast::Definition_*,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<const_slang::ast::Definition_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Definition_*>_>_>
       *this,Definition **key)

{
  EntryPointer psVar1;
  char cVar2;
  
  psVar1 = this->entries +
           ((ulong)((long)*key * -0x61c8864680b583eb) >> ((this->hash_policy).shift & 0x3fU));
  cVar2 = '\0';
  while( true ) {
    if (psVar1->distance_from_desired < cVar2) {
      return (iterator)(this->entries + this->num_slots_minus_one + (long)this->max_lookups);
    }
    if (*key == (psVar1->field_1).value) break;
    cVar2 = cVar2 + '\x01';
    psVar1 = psVar1 + 1;
  }
  return (iterator)psVar1;
}

Assistant:

size_t operator()(const T& t) const { return std::hash<T>()(t); }